

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Tensor *pTVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  byte bVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  int iVar20;
  float fVar21;
  float fVar22;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar23 [16];
  float fVar24;
  Tensor x;
  Tensor y;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 uStack_a8;
  float *pfStack_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  float *pfStack_50;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uStack_c8 = *(undefined8 *)(pTVar1->d).d;
  uStack_c0 = *(undefined8 *)((pTVar1->d).d + 2);
  local_b8 = *(undefined8 *)((pTVar1->d).d + 4);
  uStack_b0 = *(ulong *)((pTVar1->d).d + 6);
  uStack_a8 = *(undefined8 *)&(pTVar1->d).bd;
  pfStack_a0 = pTVar1->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_98,&pTVar1->bs);
  pTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start[1];
  uStack_78 = *(undefined8 *)(pTVar1->d).d;
  uStack_70 = *(undefined8 *)((pTVar1->d).d + 2);
  local_68 = *(undefined8 *)((pTVar1->d).d + 4);
  uStack_60 = *(undefined8 *)((pTVar1->d).d + 6);
  uStack_58 = *(undefined8 *)&(pTVar1->d).bd;
  pfStack_50 = pTVar1->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_48,&pTVar1->bs);
  pfVar8 = pfStack_50;
  pfVar7 = pfStack_a0;
  if (uStack_b0 >> 0x20 == 0) {
    iVar20 = 1;
  }
  else {
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f();
    uVar9 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar14);
      auVar14 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar3 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar3;
      uVar3 = vpcmpuq_avx512f(auVar14,auVar17,2);
      bVar6 = (byte)uVar3;
      uVar11 = CONCAT11(bVar6,bVar5);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&uStack_c8 + uVar9 * 4));
      auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar18._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar18._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_;
      auVar18._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar14._36_4_;
      auVar18._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar14._40_4_;
      auVar18._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar14._44_4_;
      auVar18._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar14._48_4_;
      auVar18._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar14._52_4_;
      auVar18._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar14._56_4_;
      auVar18._60_4_ = (uint)(bVar6 >> 7) * auVar14._60_4_;
      uVar9 = uVar9 + 0x10;
      auVar14 = vpmulld_avx512f(auVar18,auVar19);
    } while (((uStack_b0 >> 0x20) + 0xf & 0xfffffffffffffff0) != uVar9);
    auVar14 = vmovdqa32_avx512f(auVar14);
    auVar15._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar19._0_4_;
    bVar2 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar19._4_4_;
    bVar2 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar19._8_4_;
    bVar2 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar19._12_4_;
    bVar2 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar19._16_4_;
    bVar2 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar19._20_4_;
    bVar2 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar19._24_4_;
    bVar2 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar19._28_4_;
    auVar15._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._32_4_;
    bVar2 = (bool)(bVar6 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar19._36_4_;
    bVar2 = (bool)(bVar6 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar19._40_4_;
    bVar2 = (bool)(bVar6 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar19._44_4_;
    bVar2 = (bool)(bVar6 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar19._48_4_;
    bVar2 = (bool)(bVar6 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar19._52_4_;
    bVar2 = (bool)(bVar6 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar19._56_4_;
    auVar15._60_4_ =
         (uint)(bVar6 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar19._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
    auVar12 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar23 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpmulld_avx(auVar12,auVar23);
    auVar23 = vpshufd_avx(auVar12,0x55);
    auVar12 = vpmulld_avx(auVar12,auVar23);
    iVar20 = auVar12._0_4_;
  }
  uVar10 = iVar20 * (int)uStack_a8;
  if (uVar10 == 0) {
    fVar22 = 0.0;
  }
  else {
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    fVar22 = 0.0;
    uVar9 = 0;
    do {
      fVar24 = pfVar8[uVar9];
      fVar21 = pfVar7[uVar9];
      auVar12 = ZEXT416((uint)fVar21);
      if (fVar24 == 1.0) {
        uVar3 = vcmpss_avx512f(auVar12,auVar14._0_16_,0);
        bVar2 = (bool)((byte)uVar3 & 1);
        auVar17._0_4_ = logf((float)((uint)bVar2 * 0x800000 + (uint)!bVar2 * (int)fVar21));
        auVar17._4_60_ = extraout_var;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar12 = vxorps_avx512vl(auVar17._0_16_,auVar4);
        fVar24 = auVar12._0_4_;
      }
      else if (fVar24 == 0.0) {
        uVar3 = vcmpss_avx512f(auVar12,ZEXT416(0x3f800000),0);
        bVar2 = (bool)((byte)uVar3 & 1);
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = 0x8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar12 = vxorps_avx512vl(auVar12,auVar23);
        auVar16._0_4_ = log1pf((float)((uint)bVar2 * -0x7f800000 + (uint)!bVar2 * auVar12._0_4_));
        auVar16._4_60_ = extraout_var_00;
        auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar24),auVar16._0_16_,auVar16._0_16_);
        fVar24 = auVar12._0_4_;
      }
      else {
        auVar23 = SUB6416(ZEXT464(0x800000),0);
        if ((fVar21 != 0.0) && (auVar23 = auVar12, fVar21 == 1.0)) {
          auVar23 = SUB6416(ZEXT464(0x800000),0);
        }
        fVar21 = logf(auVar23._0_4_);
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar12 = vxorps_avx512vl(auVar23,auVar12);
        auVar14._0_4_ = log1pf(auVar12._0_4_);
        auVar14._4_60_ = extraout_var_01;
        auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar24),ZEXT416((uint)(auVar14._0_4_ - fVar21)),
                                  auVar14._0_16_);
        fVar24 = auVar12._0_4_;
      }
      uVar9 = uVar9 + 1;
      auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
      fVar22 = fVar24 + fVar22;
    } while (uVar10 != uVar9);
  }
  *fx->v = fVar22;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}